

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

string * __thiscall cmCacheManager::GetInitializedCacheValue(cmCacheManager *this,string *key)

{
  const_iterator cVar1;
  _Base_ptr p_Var2;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
          ::find(&(this->Cache)._M_t,key);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->Cache)._M_t._M_impl.super__Rb_tree_header) {
    p_Var2 = (_Base_ptr)0x0;
  }
  else {
    p_Var2 = (_Base_ptr)0x0;
    if (*(char *)&cVar1._M_node[4]._M_right != '\0') {
      p_Var2 = cVar1._M_node + 2;
    }
  }
  return (string *)p_Var2;
}

Assistant:

const std::string* cmCacheManager::GetInitializedCacheValue(
  const std::string& key) const
{
  CacheEntryMap::const_iterator i = this->Cache.find(key);
  if (i != this->Cache.end() && i->second.Initialized) {
    return &i->second.Value;
  }
  return nullptr;
}